

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O3

void Cmd_kill(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  BYTE it;
  
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    if ((dmflags2.Value._2_1_ & 0x40) != 0) {
      return;
    }
    it = '\x0f';
  }
  else {
    bVar1 = CheckCheatmode(true);
    if (bVar1) {
      return;
    }
    pcVar3 = FCommandLine::operator[](argv,1);
    iVar2 = strcasecmp(pcVar3,"monsters");
    if (iVar2 != 0) {
      Net_WriteByte('2');
      pcVar3 = FCommandLine::operator[](argv,1);
      Net_WriteString(pcVar3);
      goto LAB_0040038b;
    }
    bVar1 = CheckCheatmode(true);
    if (bVar1) {
      return;
    }
    Net_WriteByte('\n');
    it = '\x13';
  }
  Net_WriteByte(it);
LAB_0040038b:
  C_HideConsole();
  return;
}

Assistant:

CCMD (kill)
{
	if (argv.argc() > 1)
	{
		if (CheckCheatmode ())
			return;

		if (!stricmp (argv[1], "monsters"))
		{
			// Kill all the monsters
			if (CheckCheatmode ())
				return;

			Net_WriteByte (DEM_GENERICCHEAT);
			Net_WriteByte (CHT_MASSACRE);
		}
		else
		{
			Net_WriteByte (DEM_KILLCLASSCHEAT);
			Net_WriteString (argv[1]);
		}
	}
	else
	{
		// If suiciding is disabled, then don't do it.
		if (dmflags2 & DF2_NOSUICIDE)
			return;

		// Kill the player
		Net_WriteByte (DEM_SUICIDE);
	}
	C_HideConsole ();
}